

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(void)

{
  anon_class_1_0_00000001 local_439;
  functor_response local_438;
  allocator<char> local_411;
  string local_410;
  anon_class_1_0_00000001 local_3e9;
  functor_string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  server_t s;
  
  clask::server();
  clask::logger::default_level = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"/files",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"./files",&local_349);
  clask::server_t::static_dir((server_t *)local_2f0,&local_310,&local_348,false);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"/",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"./public",&local_399);
  clask::server_t::static_dir((server_t *)local_2f0,&local_370,&local_398,false);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"/api",&local_3c1);
  std::function<std::__cxx11::string(clask::request&)>::function<main::__0,void>
            ((function<std::__cxx11::string(clask::request&)> *)&local_3e8,&local_3e9);
  clask::server_t::GET((server_t *)local_2f0,&local_3c0,&local_3e8);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  ::~function(&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"/upload",&local_411);
  std::function<clask::response(clask::request&)>::function<main::__1,void>
            ((function<clask::response(clask::request&)> *)&local_438,&local_439);
  clask::server_t::POST((server_t *)local_2f0,&local_410,&local_438);
  std::function<clask::response_(clask::request_&)>::~function(&local_438);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  clask::server_t::run((server_t *)local_2f0,0x1f90);
  clask::server_t::~server_t((server_t *)local_2f0);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/files", "./files");
  s.static_dir("/", "./public");
  s.GET("/api", [](clask::request&) {
    nlohmann::json data;
    int n = 0;
    for (const auto& e : std::filesystem::directory_iterator("files")) {
      auto fn = e.path().filename().u8string();
      if (fn[0] == '.') continue;
      data[n++] = fn;
    }
    return data.dump();
  });
  s.POST("/upload", [](clask::request& req) -> clask::response {
    std::vector<clask::part> parts;
    if (req.header_value("expect") == "100-continue") {
      return clask::response {
        .code = 100,
      };
    }
    if (!req.parse_multipart(parts) || parts.size() == 0) {
      return clask::response {
        .code = 400,
        .content = "Bad Request",
      };
    }
    for (auto part : parts) {
      if (!save_file(part)) {
        return clask::response {
          .code = 400,
          .content = "Bad Request",
        };
      }
    }
    return clask::response {
      .code = 302,
      .content = "",
      .headers = {
        {"Location", "/"},
      },
    };
  });
  s.run();
}